

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_iso.c
# Opt level: O3

REF_STATUS
ref_iso_cast(REF_GRID_conflict *iso_grid_ptr,REF_DBL **iso_field_ptr,REF_GRID_conflict ref_grid,
            REF_DBL *field,REF_INT ldim,REF_DBL *segment0,REF_DBL *segment1)

{
  REF_INT *pRVar1;
  double *pdVar2;
  int iVar3;
  REF_NODE ref_node;
  REF_GRID_conflict pRVar4;
  REF_DBL *pRVar5;
  REF_CELL pRVar6;
  REF_INT *pRVar7;
  double dVar8;
  uint uVar9;
  REF_GRID ref_grid_00;
  uint uVar10;
  REF_STATUS RVar11;
  void *__ptr;
  long lVar12;
  ulong uVar13;
  undefined8 uVar14;
  long lVar15;
  int iVar16;
  REF_EDGE pRVar17;
  REF_FACE ref_face_00;
  ulong uVar18;
  long lVar19;
  char *pcVar20;
  REF_DBL **ppRVar21;
  REF_MPI pRVar22;
  int iVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  REF_EDGE pRVar26;
  REF_EDGE pRVar27;
  REF_INT part;
  REF_FACE ref_face;
  REF_EDGE ref_edge;
  REF_GLOB global;
  REF_INT edges [3];
  REF_DBL tt [2];
  REF_DBL candidate1 [3];
  REF_DBL candidate0 [3];
  REF_INT new_cell;
  REF_DBL triangle2 [3];
  REF_DBL triangle1 [3];
  REF_DBL triangle0 [3];
  REF_INT new_cell_1;
  REF_DBL tuvw [4];
  REF_INT new_nodes [27];
  uint local_200;
  uint local_1fc;
  REF_DBL *local_1f8;
  REF_DBL *local_1f0;
  REF_EDGE local_1e8;
  uint local_1e0;
  int local_1dc;
  REF_EDGE local_1d8;
  REF_MPI local_1d0;
  REF_FACE local_1c8;
  REF_EDGE local_1c0;
  REF_FACE local_1b8;
  REF_DBL **local_1b0;
  REF_GRID local_1a8;
  REF_GLOB local_1a0;
  uint local_198 [4];
  double local_188;
  REF_EDGE local_180;
  REF_DBL local_178 [4];
  REF_DBL local_158 [4];
  uint local_138 [4];
  REF_DBL local_128;
  REF_DBL RStack_120;
  REF_DBL local_118;
  REF_DBL local_108;
  REF_DBL RStack_100;
  REF_DBL local_f8;
  REF_DBL local_e8;
  REF_DBL RStack_e0;
  REF_DBL local_d8;
  REF_INT local_cc;
  REF_EDGE local_c8;
  double local_c0 [3];
  REF_INT local_a8;
  undefined4 local_a4;
  undefined4 local_a0;
  
  pRVar22 = ref_grid->mpi;
  ref_node = ref_grid->node;
  local_1c0 = (REF_EDGE)0x0;
  local_1c8 = (REF_FACE)0x0;
  local_1f8 = segment0;
  local_1e0 = ldim;
  uVar10 = ref_node_synchronize_globals(ref_node);
  if (uVar10 != 0) {
    pcVar20 = "sync glob";
    uVar14 = 0x213;
    goto LAB_0019bdda;
  }
  local_1f0 = field;
  local_1b0 = iso_field_ptr;
  local_1a8 = ref_grid;
  uVar10 = ref_grid_create(iso_grid_ptr,pRVar22);
  ref_grid_00 = local_1a8;
  if (uVar10 != 0) {
    pcVar20 = "create";
    uVar14 = 0x215;
    goto LAB_0019bdda;
  }
  pRVar4 = *iso_grid_ptr;
  pRVar4->twod = local_1a8->twod;
  uVar10 = ref_node_initialize_n_global(pRVar4->node,0);
  if (uVar10 != 0) {
    pcVar20 = "zero glob";
    uVar14 = 0x218;
    goto LAB_0019bdda;
  }
  local_1d0 = pRVar22;
  if (ref_grid_00->twod == 0) {
    uVar10 = ref_face_create(&local_1c8,ref_grid_00);
    ref_face_00 = local_1c8;
    if (uVar10 != 0) {
      pcVar20 = "create face";
      uVar14 = 0x239;
      goto LAB_0019bdda;
    }
    iVar16 = local_1c8->n;
    if ((long)iVar16 < 0) {
      pcVar20 = "malloc new_node of REF_INT negative";
      uVar14 = 0x23a;
      goto LAB_0019c6ea;
    }
    __ptr = malloc((long)iVar16 * 4);
    if (__ptr == (void *)0x0) {
      pcVar20 = "malloc new_node of REF_INT NULL";
      uVar14 = 0x23a;
      goto LAB_0019c744;
    }
    if (iVar16 == 0) {
      local_200 = 0;
    }
    else {
      lVar12 = 0;
      do {
        *(undefined4 *)((long)__ptr + lVar12 * 4) = 0xffffffff;
        lVar12 = lVar12 + 1;
      } while (lVar12 < ref_face_00->n);
      local_200 = 0;
      if (0 < ref_face_00->n) {
        do {
          uVar9 = local_200;
          pRVar5 = ref_node->real;
          pRVar1 = ref_face_00->f2n;
          uVar13 = (ulong)(local_200 * 4);
          local_d8 = pRVar5[(long)pRVar1[uVar13] * 0xf + 2];
          local_e8 = pRVar5[(long)pRVar1[uVar13] * 0xf];
          RStack_e0 = (pRVar5 + (long)pRVar1[uVar13] * 0xf)[1];
          local_f8 = pRVar5[(long)pRVar1[uVar13 + 1] * 0xf + 2];
          local_108 = pRVar5[(long)pRVar1[uVar13 + 1] * 0xf];
          RStack_100 = (pRVar5 + (long)pRVar1[uVar13 + 1] * 0xf)[1];
          local_128 = pRVar5[(long)pRVar1[uVar13 + 2] * 0xf];
          RStack_120 = (pRVar5 + (long)pRVar1[uVar13 + 2] * 0xf)[1];
          local_118 = pRVar5[(long)pRVar1[uVar13 + 2] * 0xf + 2];
          RVar11 = ref_iso_triangle_segment
                             (&local_e8,&local_108,&local_128,local_1f8,segment1,
                              (REF_DBL *)&local_c8);
          if (RVar11 == 0) {
            uVar24 = SUB84(local_c0[0],0);
            uVar25 = (undefined4)((ulong)local_c0[0] >> 0x20);
            if (local_c0[1] <= local_c0[0]) {
              uVar24 = SUB84(local_c0[1],0);
              uVar25 = (undefined4)((ulong)local_c0[1] >> 0x20);
            }
            if (local_c0[2] <= (double)CONCAT44(uVar25,uVar24)) {
              uVar24 = SUB84(local_c0[2],0);
              uVar25 = (undefined4)((ulong)local_c0[2] >> 0x20);
            }
            if (0.0 < (double)CONCAT44(uVar25,uVar24) || (double)CONCAT44(uVar25,uVar24) == 0.0) {
              pRVar27 = (REF_EDGE)(1.0 - (double)local_c8);
              pRVar17 = local_c8;
              if ((double)pRVar27 <= (double)local_c8) {
                pRVar17 = pRVar27;
              }
              if (0.0 <= (double)pRVar17) {
                local_1d8 = local_c8;
                local_1e8 = pRVar27;
                uVar10 = ref_face_part(ref_face_00,ref_node,uVar9,&local_1dc);
                if (uVar10 != 0) {
                  pcVar20 = "face part";
                  uVar14 = 0x24d;
                  goto LAB_0019bdda;
                }
                if (local_1d0->id == local_1dc) {
                  uVar10 = ref_node_next_global(pRVar4->node,&local_1a0);
                  if (uVar10 != 0) {
                    pcVar20 = "next global";
                    uVar14 = 0x250;
                    goto LAB_0019bdda;
                  }
                  local_1b8 = (REF_FACE)((long)__ptr + (ulong)uVar9 * 4);
                  uVar10 = ref_node_add(pRVar4->node,local_1a0,(REF_INT *)local_1b8);
                  if (uVar10 != 0) {
                    pcVar20 = "add node";
                    uVar14 = 0x252;
                    goto LAB_0019bdda;
                  }
                  iVar16 = local_1b8->n;
                  pRVar5 = pRVar4->node->real;
                  lVar12 = 0;
                  do {
                    pRVar5[(long)iVar16 * 0xf + lVar12] =
                         segment1[lVar12] * (double)local_1d8 +
                         local_1f8[lVar12] * (double)local_1e8;
                    lVar12 = lVar12 + 1;
                  } while (lVar12 != 3);
                }
              }
            }
          }
          local_200 = uVar9 + 1;
          ref_face_00 = local_1c8;
        } while ((int)local_200 < local_1c8->n);
      }
    }
  }
  else {
    uVar10 = ref_edge_create(&local_1c0,ref_grid_00);
    pRVar17 = local_1c0;
    if (uVar10 != 0) {
      pcVar20 = "create edge";
      uVar14 = 0x21b;
      goto LAB_0019bdda;
    }
    iVar16 = local_1c0->n;
    if ((long)iVar16 < 0) {
      pcVar20 = "malloc new_node of REF_INT negative";
      uVar14 = 0x21c;
      goto LAB_0019c6ea;
    }
    __ptr = malloc((long)iVar16 * 4);
    if (__ptr == (void *)0x0) {
      pcVar20 = "malloc new_node of REF_INT NULL";
      uVar14 = 0x21c;
      goto LAB_0019c744;
    }
    if (iVar16 == 0) {
      local_1fc = 0;
    }
    else {
      lVar12 = 0;
      do {
        *(undefined4 *)((long)__ptr + lVar12 * 4) = 0xffffffff;
        lVar12 = lVar12 + 1;
      } while (lVar12 < pRVar17->n);
      local_1fc = 0;
      if (0 < pRVar17->n) {
        do {
          uVar9 = local_1fc;
          pRVar5 = ref_node->real;
          lVar15 = (long)pRVar17->e2n[local_1fc * 2];
          uVar13 = (ulong)local_1fc;
          lVar12 = (long)pRVar17->e2n[uVar13 * 2 + 1];
          local_158[2] = pRVar5[lVar15 * 0xf + 2];
          local_158[0] = pRVar5[lVar15 * 0xf];
          local_158[1] = (pRVar5 + lVar15 * 0xf)[1];
          local_178[0] = pRVar5[lVar12 * 0xf];
          local_178[1] = (pRVar5 + lVar12 * 0xf)[1];
          local_178[2] = pRVar5[lVar12 * 0xf + 2];
          RVar11 = ref_iso_segment_segment(local_158,local_178,local_1f8,segment1,&local_188);
          if (RVar11 == 0) {
            dVar8 = local_188;
            if (1.0 - local_188 <= local_188) {
              dVar8 = 1.0 - local_188;
            }
            if (0.0 <= dVar8) {
              pRVar26 = (REF_EDGE)(1.0 - (double)local_180);
              pRVar27 = local_180;
              if ((double)pRVar26 <= (double)local_180) {
                pRVar27 = pRVar26;
              }
              if (0.0 <= (double)pRVar27) {
                local_1d8 = local_180;
                local_1e8 = pRVar26;
                uVar10 = ref_edge_part(pRVar17,uVar9,&local_1dc);
                if (uVar10 != 0) {
                  pcVar20 = "edge part";
                  uVar14 = 0x22c;
                  goto LAB_0019bdda;
                }
                if (local_1d0->id == local_1dc) {
                  uVar10 = ref_node_next_global(pRVar4->node,&local_1a0);
                  if (uVar10 != 0) {
                    pcVar20 = "next global";
                    uVar14 = 0x22f;
                    goto LAB_0019bdda;
                  }
                  pRVar1 = (REF_INT *)((long)__ptr + uVar13 * 4);
                  uVar10 = ref_node_add(pRVar4->node,local_1a0,pRVar1);
                  if (uVar10 != 0) {
                    pcVar20 = "add node";
                    uVar14 = 0x231;
                    goto LAB_0019bdda;
                  }
                  iVar16 = *pRVar1;
                  pRVar5 = pRVar4->node->real;
                  lVar12 = 0;
                  do {
                    pRVar5[(long)iVar16 * 0xf + lVar12] =
                         local_178[lVar12] * (double)local_1e8 +
                         local_158[lVar12] * (double)local_1d8;
                    lVar12 = lVar12 + 1;
                  } while (lVar12 != 3);
                }
              }
            }
          }
          local_1fc = uVar9 + 1;
          pRVar17 = local_1c0;
        } while ((int)local_1fc < local_1c0->n);
      }
    }
  }
  ppRVar21 = local_1b0;
  uVar9 = local_1e0;
  if (local_1f0 == (REF_DBL *)0x0) {
    *local_1b0 = (REF_DBL *)0x0;
    if (ref_grid_00->twod != 0) goto LAB_0019c59d;
LAB_0019c8e3:
    pRVar6 = local_1a8->cell[8];
    iVar16 = pRVar6->max;
    if (0 < iVar16) {
      iVar23 = 0;
      do {
        if (pRVar6->c2n[(long)pRVar6->size_per * (long)iVar23] != -1) {
          if (0 < pRVar6->face_per) {
            local_1f8 = (REF_DBL *)CONCAT44(local_1f8._4_4_,iVar23);
            lVar12 = 0;
            lVar15 = 0;
            iVar16 = 0;
            do {
              pRVar1 = pRVar6->c2n;
              iVar3 = pRVar6->size_per;
              pRVar7 = pRVar6->f2n;
              lVar19 = 0;
              do {
                local_198[lVar19] =
                     pRVar1[(long)*(int *)((long)pRVar7 + lVar19 * 4 + lVar12) +
                            (long)iVar3 * (long)iVar23];
                lVar19 = lVar19 + 1;
              } while (lVar19 != 4);
              uVar10 = ref_face_with(local_1c8,(REF_INT *)local_198,(REF_INT *)&local_200);
              if (uVar10 != 0) {
                pcVar20 = "get face";
                uVar14 = 0x2b9;
                goto LAB_0019bdda;
              }
              if (*(int *)((long)__ptr + (long)(int)local_200 * 4) != -1) {
                local_138[iVar16] = local_200;
                iVar16 = iVar16 + 1;
              }
              lVar15 = lVar15 + 1;
              lVar12 = lVar12 + 0x10;
            } while (lVar15 < pRVar6->face_per);
            iVar23 = (int)local_1f8;
            if (iVar16 == 2) {
              local_a8 = *(REF_INT *)((long)__ptr + (long)(int)local_138[0] * 4);
              local_a4 = *(undefined4 *)((long)__ptr + (long)(int)local_138[1] * 4);
              local_a0 = 1;
              uVar10 = ref_cell_add(pRVar4->cell[0],&local_a8,&local_cc);
              if (uVar10 != 0) {
                pcVar20 = "add";
                uVar14 = 0x2c3;
                goto LAB_0019bdda;
              }
            }
          }
          iVar16 = pRVar6->max;
        }
        iVar23 = iVar23 + 1;
      } while (iVar23 < iVar16);
    }
  }
  else {
    uVar10 = pRVar4->node->max * local_1e0;
    if ((int)uVar10 < 0) {
      pcVar20 = "malloc *iso_field_ptr of REF_DBL negative";
      uVar14 = 0x261;
LAB_0019c6ea:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",uVar14,
             "ref_iso_cast",pcVar20);
      return 1;
    }
    local_1d8 = (REF_EDGE)malloc((ulong)uVar10 << 3);
    *ppRVar21 = (REF_DBL *)local_1d8;
    if (local_1d8 == (REF_EDGE)0x0) {
      pcVar20 = "malloc *iso_field_ptr of REF_DBL NULL";
      uVar14 = 0x261;
      local_1d8 = (REF_EDGE)0x0;
LAB_0019c744:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",uVar14,
             "ref_iso_cast",pcVar20);
      return 2;
    }
    if (ref_grid_00->twod == 0) {
      local_200 = 0;
      local_1b8 = local_1c8;
      local_1e8 = (REF_EDGE)CONCAT44(local_1e8._4_4_,local_1c8->n);
      if (0 < local_1c8->n) {
        ppRVar21 = (REF_DBL **)0x0;
        pRVar22 = (REF_MPI)0x0;
        do {
          iVar16 = *(int *)((long)__ptr + (long)pRVar22 * 4);
          if (iVar16 != -1) {
            pRVar5 = ref_node->real;
            pRVar1 = local_1b8->f2n;
            uVar13 = (ulong)(uint)((int)pRVar22 * 4);
            local_d8 = pRVar5[(long)pRVar1[uVar13] * 0xf + 2];
            local_e8 = pRVar5[(long)pRVar1[uVar13] * 0xf];
            RStack_e0 = (pRVar5 + (long)pRVar1[uVar13] * 0xf)[1];
            local_f8 = pRVar5[(long)pRVar1[uVar13 + 1] * 0xf + 2];
            local_108 = pRVar5[(long)pRVar1[uVar13 + 1] * 0xf];
            RStack_100 = (pRVar5 + (long)pRVar1[uVar13 + 1] * 0xf)[1];
            local_128 = pRVar5[(long)pRVar1[uVar13 + 2] * 0xf];
            RStack_120 = (pRVar5 + (long)pRVar1[uVar13 + 2] * 0xf)[1];
            local_118 = pRVar5[(long)pRVar1[uVar13 + 2] * 0xf + 2];
            local_1d0 = pRVar22;
            local_1b0 = ppRVar21;
            uVar10 = ref_iso_triangle_segment
                               (&local_e8,&local_108,&local_128,local_1f8,segment1,
                                (REF_DBL *)&local_c8);
            if (uVar10 != 0) {
              pcVar20 = "tuvw";
              uVar14 = 0x287;
              goto LAB_0019bdda;
            }
            ppRVar21 = local_1b0;
            pRVar22 = local_1d0;
            if (0 < (int)local_1e0) {
              uVar13 = 0;
              do {
                dVar8 = 0.0;
                lVar12 = 0;
                do {
                  pdVar2 = local_c0 + lVar12;
                  lVar15 = ((ulong)local_1b0 & 0xffffffff) + lVar12;
                  lVar12 = lVar12 + 1;
                  dVar8 = dVar8 + *pdVar2 * local_1f0[uVar13 + (long)pRVar1[lVar15] *
                                                               (long)(int)uVar9];
                } while (lVar12 != 3);
                *(double *)(&local_1d8->n + (long)(int)(iVar16 * local_1e0) * 2 + uVar13 * 2) =
                     dVar8;
                uVar13 = uVar13 + 1;
              } while (uVar13 != uVar9);
            }
          }
          local_200 = (int)pRVar22 + 1;
          pRVar22 = (REF_MPI)(ulong)local_200;
          ppRVar21 = (REF_DBL **)(ulong)((int)ppRVar21 + 4);
        } while ((int)local_200 < (int)local_1e8);
      }
      goto LAB_0019c8e3;
    }
    local_1fc = 0;
    local_1e8 = local_1c0;
    local_1b0 = (REF_DBL **)CONCAT44(local_1b0._4_4_,local_1c0->n);
    if (0 < local_1c0->n) {
      uVar13 = 0;
      local_1b8 = (REF_FACE)(long)(int)uVar9;
      do {
        iVar16 = *(int *)((long)__ptr + uVar13 * 4);
        if (iVar16 != -1) {
          pRVar5 = ref_node->real;
          local_1d0 = (REF_MPI)(long)local_1e8->e2n[(uint)((int)uVar13 * 2)];
          lVar12 = (long)local_1e8->e2n[uVar13 * 2 + 1];
          local_158[2] = pRVar5[(long)local_1d0 * 0xf + 2];
          local_158[0] = pRVar5[(long)local_1d0 * 0xf];
          local_158[1] = (pRVar5 + (long)local_1d0 * 0xf)[1];
          local_178[0] = pRVar5[lVar12 * 0xf];
          local_178[1] = (pRVar5 + lVar12 * 0xf)[1];
          local_178[2] = pRVar5[lVar12 * 0xf + 2];
          uVar10 = ref_iso_segment_segment(local_158,local_178,local_1f8,segment1,&local_188);
          if (uVar10 != 0) {
            pcVar20 = "seg-seg";
            uVar14 = 0x26f;
            goto LAB_0019bdda;
          }
          if (0 < (int)local_1e0) {
            uVar18 = 0;
            do {
              *(double *)(&local_1d8->n + (long)(int)(iVar16 * local_1e0) * 2 + uVar18 * 2) =
                   local_1f0[(long)local_1d0 * (long)local_1b8 + uVar18] * (1.0 - (double)local_180)
                   + local_1f0[lVar12 * (long)local_1b8 + uVar18] * (double)local_180;
              uVar18 = uVar18 + 1;
            } while (uVar9 != uVar18);
          }
        }
        local_1fc = (int)uVar13 + 1;
        uVar13 = (ulong)local_1fc;
      } while ((int)local_1fc < (int)local_1b0);
    }
LAB_0019c59d:
    pRVar6 = local_1a8->cell[3];
    iVar16 = pRVar6->max;
    if (0 < iVar16) {
      iVar23 = 0;
      do {
        if (pRVar6->c2n[(long)pRVar6->size_per * (long)iVar23] != -1) {
          if (0 < pRVar6->edge_per) {
            lVar12 = 0;
            iVar16 = 0;
            do {
              lVar15 = (long)pRVar6->size_per * (long)iVar23;
              uVar10 = ref_edge_with(local_1c0,pRVar6->c2n[pRVar6->e2n[lVar12 * 2] + lVar15],
                                     pRVar6->c2n
                                     [(long)(int)lVar15 + (long)pRVar6->e2n[lVar12 * 2 + 1]],
                                     (REF_INT *)&local_1fc);
              if (uVar10 != 0) {
                pcVar20 = "get edge";
                uVar14 = 0x2a1;
                goto LAB_0019bdda;
              }
              if (*(int *)((long)__ptr + (long)(int)local_1fc * 4) != -1) {
                local_198[iVar16] = local_1fc;
                iVar16 = iVar16 + 1;
              }
              lVar12 = lVar12 + 1;
            } while (lVar12 < pRVar6->edge_per);
            if (iVar16 == 2) {
              local_a8 = *(REF_INT *)((long)__ptr + (long)(int)local_198[0] * 4);
              local_a4 = *(undefined4 *)((long)__ptr + (long)(int)local_198[1] * 4);
              local_a0 = 1;
              uVar10 = ref_cell_add(pRVar4->cell[0],&local_a8,(REF_INT *)local_138);
              if (uVar10 != 0) {
                pcVar20 = "add";
                uVar14 = 0x2ab;
                goto LAB_0019bdda;
              }
            }
          }
          iVar16 = pRVar6->max;
        }
        iVar23 = iVar23 + 1;
      } while (iVar23 < iVar16);
    }
  }
  if ((local_1c8 == (REF_FACE)0x0) || (uVar10 = ref_face_free(local_1c8), uVar10 == 0)) {
    if ((local_1c0 == (REF_EDGE)0x0) || (uVar10 = ref_edge_free(local_1c0), uVar10 == 0)) {
      free(__ptr);
      return 0;
    }
    pcVar20 = "free";
    uVar14 = 0x2cc;
  }
  else {
    pcVar20 = "free";
    uVar14 = 0x2c9;
  }
LAB_0019bdda:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",uVar14,
         "ref_iso_cast",(ulong)uVar10,pcVar20);
  return uVar10;
}

Assistant:

REF_FCN REF_STATUS ref_iso_cast(REF_GRID *iso_grid_ptr, REF_DBL **iso_field_ptr,
                                REF_GRID ref_grid, REF_DBL *field, REF_INT ldim,
                                REF_DBL *segment0, REF_DBL *segment1) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = NULL;
  REF_GRID iso_grid;
  REF_EDGE ref_edge = NULL;
  REF_FACE ref_face = NULL;
  REF_INT edge, face, i, j, part, cell;
  REF_GLOB global;
  REF_INT *new_node = NULL;
  REF_DBL candidate0[3], candidate1[3];
  REF_DBL triangle0[3], triangle1[3], triangle2[3];
  REF_DBL tt[2], ss[2], tuvw[4];
  REF_DBL inside = 0.0;
  REF_DBL t0, t1;
  REF_INT id = 1;
  REF_DBL *iso_field;

  RSS(ref_node_synchronize_globals(ref_node), "sync glob");

  RSS(ref_grid_create(iso_grid_ptr, ref_mpi), "create");
  iso_grid = *iso_grid_ptr;
  ref_grid_twod(iso_grid) = ref_grid_twod(ref_grid);
  RSS(ref_node_initialize_n_global(ref_grid_node(iso_grid), 0), "zero glob");

  if (ref_grid_twod(ref_grid)) {
    RSS(ref_edge_create(&ref_edge, ref_grid), "create edge");
    ref_malloc_init(new_node, ref_edge_n(ref_edge), REF_INT, REF_EMPTY);
    each_ref_edge(ref_edge, edge) {
      for (i = 0; i < 3; i++) {
        candidate0[i] =
            ref_node_xyz(ref_node, i, ref_edge_e2n(ref_edge, 0, edge));
        candidate1[i] =
            ref_node_xyz(ref_node, i, ref_edge_e2n(ref_edge, 1, edge));
      }
      if (REF_SUCCESS != ref_iso_segment_segment(candidate0, candidate1,
                                                 segment0, segment1, tt))
        continue;
      ss[0] = 1.0 - tt[0];
      ss[1] = 1.0 - tt[1];
      if (MIN(tt[0], ss[0]) < inside) continue;
      if (MIN(tt[1], ss[1]) < inside) continue;

      RSS(ref_edge_part(ref_edge, edge, &part), "edge part");
      if (ref_mpi_rank(ref_mpi) == part) {
        RSS(ref_node_next_global(ref_grid_node(iso_grid), &global),
            "next global");
        RSS(ref_node_add(ref_grid_node(iso_grid), global, &(new_node[edge])),
            "add node");
        for (i = 0; i < 3; i++) {
          ref_node_xyz(ref_grid_node(iso_grid), i, new_node[edge]) =
              ss[1] * candidate1[i] + tt[1] * candidate0[i];
        }
      }
    }
  } else {
    RSS(ref_face_create(&ref_face, ref_grid), "create face");
    ref_malloc_init(new_node, ref_face_n(ref_face), REF_INT, REF_EMPTY);

    each_ref_face(ref_face, face) {
      for (i = 0; i < 3; i++) {
        triangle0[i] =
            ref_node_xyz(ref_node, i, ref_face_f2n(ref_face, 0, face));
        triangle1[i] =
            ref_node_xyz(ref_node, i, ref_face_f2n(ref_face, 1, face));
        triangle2[i] =
            ref_node_xyz(ref_node, i, ref_face_f2n(ref_face, 2, face));
      }
      if (REF_SUCCESS != ref_iso_triangle_segment(triangle0, triangle1,
                                                  triangle2, segment0, segment1,
                                                  tuvw))
        continue;
      if (MIN(MIN(tuvw[1], tuvw[2]), tuvw[3]) < inside) continue;
      /* exclude intersections outside of segment */
      if (MIN(tuvw[0], 1.0 - tuvw[0]) < inside) continue;

      RSS(ref_face_part(ref_face, ref_node, face, &part), "face part");
      if (ref_mpi_rank(ref_mpi) == part) {
        RSS(ref_node_next_global(ref_grid_node(iso_grid), &global),
            "next global");
        RSS(ref_node_add(ref_grid_node(iso_grid), global, &(new_node[face])),
            "add node");
        t1 = tuvw[0];
        t0 = 1.0 - t1;
        for (i = 0; i < 3; i++) {
          ref_node_xyz(ref_grid_node(iso_grid), i, new_node[face]) =
              t1 * segment1[i] + t0 * segment0[i];
        }
      }
    }
  }
  if (NULL == field) {
    *iso_field_ptr = NULL;
  } else {
    REF_INT node;
    ref_malloc(*iso_field_ptr, ldim * ref_node_max(ref_grid_node(iso_grid)),
               REF_DBL);
    iso_field = *iso_field_ptr;
    if (ref_grid_twod(ref_grid)) {
      each_ref_edge(ref_edge, edge) {
        node = new_node[edge];
        if (REF_EMPTY != node) {
          for (i = 0; i < 3; i++) {
            candidate0[i] =
                ref_node_xyz(ref_node, i, ref_edge_e2n(ref_edge, 0, edge));
            candidate1[i] =
                ref_node_xyz(ref_node, i, ref_edge_e2n(ref_edge, 1, edge));
          }
          RSS(ref_iso_segment_segment(candidate0, candidate1, segment0,
                                      segment1, tt),
              "seg-seg");
          ss[0] = 1.0 - tt[0];
          ss[1] = 1.0 - tt[1];
          for (j = 0; j < ldim; j++) {
            iso_field[j + ldim * node] =
                ss[1] * field[j + ldim * ref_edge_e2n(ref_edge, 0, edge)] +
                tt[1] * field[j + ldim * ref_edge_e2n(ref_edge, 1, edge)];
          }
        }
      }
    } else {
      each_ref_face(ref_face, face) {
        node = new_node[face];
        if (REF_EMPTY != node) {
          for (i = 0; i < 3; i++) {
            triangle0[i] =
                ref_node_xyz(ref_node, i, ref_face_f2n(ref_face, 0, face));
            triangle1[i] =
                ref_node_xyz(ref_node, i, ref_face_f2n(ref_face, 1, face));
            triangle2[i] =
                ref_node_xyz(ref_node, i, ref_face_f2n(ref_face, 2, face));
          }
          RSS(ref_iso_triangle_segment(triangle0, triangle1, triangle2,
                                       segment0, segment1, tuvw),
              "tuvw");
          for (j = 0; j < ldim; j++) {
            iso_field[j + ldim * node] = 0.0;
            for (i = 0; i < 3; i++) {
              iso_field[j + ldim * node] +=
                  tuvw[i + 1] *
                  field[j + ldim * ref_face_f2n(ref_face, i, face)];
            }
          }
        }
      }
    }
  }

  if (ref_grid_twod(ref_grid)) {
    ref_cell = ref_grid_tri(ref_grid);
    each_ref_cell_valid_cell(ref_cell, cell) {
      REF_INT cell_edge, node, edge_nodes[2];
      REF_INT nedge, edges[3];
      REF_INT new_nodes[REF_CELL_MAX_SIZE_PER], new_cell;
      nedge = 0;
      each_ref_cell_cell_edge(ref_cell, cell_edge) {
        for (node = 0; node < 2; node++) {
          edge_nodes[node] = ref_cell_e2n(ref_cell, node, cell_edge, cell);
        }
        RSS(ref_edge_with(ref_edge, edge_nodes[0], edge_nodes[1], &edge),
            "get edge");
        if (REF_EMPTY != new_node[edge]) {
          edges[nedge] = edge;
          nedge++;
        }
      }
      if (2 == nedge) {
        new_nodes[0] = new_node[edges[0]];
        new_nodes[1] = new_node[edges[1]];
        new_nodes[2] = id;
        RSS(ref_cell_add(ref_grid_edg(iso_grid), new_nodes, &new_cell), "add");
      }
    }
  } else {
    ref_cell = ref_grid_tet(ref_grid);
    each_ref_cell_valid_cell(ref_cell, cell) {
      REF_INT cell_face, node, face_nodes[4];
      REF_INT nface, faces[4];
      REF_INT new_nodes[REF_CELL_MAX_SIZE_PER], new_cell;
      nface = 0;
      each_ref_cell_cell_face(ref_cell, cell_face) {
        for (node = 0; node < 4; node++) {
          face_nodes[node] = ref_cell_f2n(ref_cell, node, cell_face, cell);
        }
        RSS(ref_face_with(ref_face, face_nodes, &face), "get face");
        if (REF_EMPTY != new_node[face]) {
          faces[nface] = face;
          nface++;
        }
      }
      if (2 == nface) {
        new_nodes[0] = new_node[faces[0]];
        new_nodes[1] = new_node[faces[1]];
        new_nodes[2] = id;
        RSS(ref_cell_add(ref_grid_edg(iso_grid), new_nodes, &new_cell), "add");
      }
    }
  }

  if (NULL != ref_face) {
    RSS(ref_face_free(ref_face), "free");
  }
  if (NULL != ref_edge) {
    RSS(ref_edge_free(ref_edge), "free");
  }
  ref_free(new_node);
  return REF_SUCCESS;
}